

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

DominatorIterator * __thiscall spvtools::val::BasicBlock::structural_pdom_begin(BasicBlock *this)

{
  DominatorIterator *in_RDI;
  
  in_RDI->current_ = this;
  *(undefined8 *)&(in_RDI->dom_func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->dom_func_).super__Function_base._M_functor + 8) = 0;
  (in_RDI->dom_func_)._M_invoker =
       std::
       _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
       ::_M_invoke;
  (in_RDI->dom_func_).super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
       ::_M_manager;
  return in_RDI;
}

Assistant:

const BasicBlock::DominatorIterator BasicBlock::structural_pdom_begin() const {
  return DominatorIterator(this, [](const BasicBlock* b) {
    return b->immediate_structural_post_dominator();
  });
}